

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::BasicWriter<char>::write_unsigned_decimal<unsigned_int>
          (BasicWriter<char> *this,uint value,uint prefix_size)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  byte bVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  
  uVar4 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = (uVar4 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  iVar5 = uVar4 - (value < internal::BasicData<void>::POWERS_OF_10_32[uVar4]);
  pBVar1 = this->buffer_;
  sVar2 = pBVar1->size_;
  uVar10 = (iVar5 + prefix_size + 1) + sVar2;
  if (pBVar1->capacity_ < uVar10) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar10);
  }
  pBVar1->size_ = uVar10;
  pcVar9 = this->buffer_->ptr_ + sVar2;
  pcVar6 = pcVar9 + (ulong)(iVar5 + 1) + (ulong)prefix_size;
  uVar4 = value;
  if (99 < value) {
    do {
      value = uVar4 / 100;
      *(undefined2 *)(pcVar6 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)(uVar4 % 100) * 2);
      pcVar6 = pcVar6 + -2;
      bVar3 = 9999 < uVar4;
      uVar4 = uVar4 / 100;
    } while (bVar3);
  }
  if (value < 10) {
    bVar7 = (byte)value | 0x30;
    lVar8 = -1;
  }
  else {
    pcVar6[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                 [((ulong)value * 2 & 0xffffffff) + 1];
    bVar7 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [(ulong)value * 2];
    lVar8 = -2;
  }
  pcVar6[lVar8] = bVar7;
  return pcVar9;
}

Assistant:

Char *write_unsigned_decimal(UInt value, unsigned prefix_size = 0) {
    unsigned num_digits = internal::count_digits(value);
    Char *ptr = get(grow_buffer(prefix_size + num_digits));
    internal::format_decimal(ptr + prefix_size, value, num_digits);
    return ptr;
  }